

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  cmMakefile *this_00;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar1;
  char *pcVar2;
  cmLocalGenerator *pcVar3;
  ostream *poVar4;
  cmGlobalGenerator *this_01;
  cmLocalGenerator *pcVar5;
  char *pcVar6;
  uint uVar7;
  string *psVar8;
  pointer pbVar9;
  pointer pbVar10;
  bool bVar11;
  bool bVar12;
  int result_1;
  string dep_newest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  int result;
  undefined4 uStack_a74;
  string out_oldest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  Snapshot local_888;
  Snapshot local_870;
  cmake cm;
  cmGlobalGenerator gg;
  
  pcVar2 = cmsys::SystemTools::GetEnv("VERBOSE");
  if (pcVar2 == (char *)0x0) {
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      return 1;
    }
    bVar11 = false;
  }
  else {
    pcVar2 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar11 = pcVar2 == (char *)0x0;
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      if (pcVar2 != (char *)0x0) {
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
      std::operator<<((ostream *)&gg,"Re-run cmake no build system arguments\n");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout
                ((char *)cm.Generators.
                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_0037eb3b;
    }
  }
  psVar8 = &this->CheckBuildSystemArgument;
  bVar1 = cmsys::SystemTools::FileExists((this->CheckBuildSystemArgument)._M_dataplus._M_p);
  if (!bVar1) {
    if (bVar11 == false) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
    poVar4 = std::operator<<((ostream *)&gg,"Re-run cmake missing file: ");
    poVar4 = std::operator<<(poVar4,(string *)psVar8);
    std::operator<<(poVar4,"\n");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout
              ((char *)cm.Generators.
                       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
LAB_0037eb3b:
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
    return 1;
  }
  cmake(&cm);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&msg_2);
  cmState::SetSourceDirectory(cm.State,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&msg_2);
  cmState::SetBinaryDirectory(cm.State,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  cmState::Snapshot::Snapshot(&local_870,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_870.Position.Tree;
  snapshot.State = local_870.State;
  snapshot.Position.Position = local_870.Position.Position;
  pcVar3 = cmGlobalGenerator::MakeLocalGenerator(&gg,snapshot,(cmLocalGenerator *)0x0);
  this_00 = pcVar3->Makefile;
  bVar1 = cmMakefile::ReadListFile(this_00,(psVar8->_M_dataplus)._M_p);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccuredFlag(), bVar1)) {
    uVar7 = 1;
    if (bVar11 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
      poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake error reading : ");
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&dep_newest);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
    }
  }
  else {
    if (this->ClearBuildSystem == true) {
      std::__cxx11::string::string
                ((string *)&msg_2,"CMAKE_DEPENDS_GENERATOR",(allocator *)&dep_newest);
      pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&msg_2);
      std::__cxx11::string::~string((string *)&msg_2);
      if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
        pcVar2 = "Unix Makefiles";
      }
      std::__cxx11::string::string((string *)&msg_2,pcVar2,(allocator *)&dep_newest);
      this_01 = CreateGlobalGenerator(this,(string *)&msg_2);
      std::__cxx11::string::~string((string *)&msg_2);
      if (this_01 != (cmGlobalGenerator *)0x0) {
        cmState::Snapshot::Snapshot(&local_888,(cmState *)0x0,(PositionType)ZEXT816(0));
        snapshot_00.Position.Tree = local_888.Position.Tree;
        snapshot_00.State = local_888.State;
        snapshot_00.Position.Position = local_888.Position.Position;
        pcVar5 = cmGlobalGenerator::MakeLocalGenerator(this_01,snapshot_00,(cmLocalGenerator *)0x0);
        (*pcVar5->_vptr_cmLocalGenerator[9])(pcVar5,this_00,(ulong)bVar11);
        (*pcVar5->_vptr_cmLocalGenerator[1])(pcVar5);
        (*this_01->_vptr_cmGlobalGenerator[1])(this_01);
      }
    }
    products.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    products.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    products.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)&msg_2,"CMAKE_MAKEFILE_PRODUCTS",(allocator *)&dep_newest);
    pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&msg_2);
    std::__cxx11::string::~string((string *)&msg_2);
    psVar8 = products.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&msg_2,pcVar2,(allocator *)&dep_newest);
      cmSystemTools::ExpandListArgument((string *)&msg_2,&products,false);
      std::__cxx11::string::~string((string *)&msg_2);
      psVar8 = products.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; psVar8 != products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
      bVar1 = cmsys::SystemTools::FileExists((psVar8->_M_dataplus)._M_p);
      if ((!bVar1) && (bVar1 = cmsys::SystemTools::FileIsSymlink(psVar8), !bVar1)) {
        uVar7 = 1;
        if (bVar11 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
          poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake, missing byproduct: ");
          poVar4 = std::operator<<(poVar4,(string *)psVar8);
          std::operator<<(poVar4,"\n");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&dep_newest);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
        }
        goto LAB_0037f1c3;
      }
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&msg_2,"CMAKE_MAKEFILE_DEPENDS",(allocator *)&dep_newest)
    ;
    pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&msg_2);
    std::__cxx11::string::~string((string *)&msg_2);
    std::__cxx11::string::string((string *)&msg_2,"CMAKE_MAKEFILE_OUTPUTS",(allocator *)&dep_newest)
    ;
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)&msg_2);
    std::__cxx11::string::~string((string *)&msg_2);
    if (pcVar6 != (char *)0x0 && pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&msg_2,pcVar2,(allocator *)&dep_newest);
      cmSystemTools::ExpandListArgument((string *)&msg_2,&depends,false);
      std::__cxx11::string::~string((string *)&msg_2);
      std::__cxx11::string::string((string *)&msg_2,pcVar6,(allocator *)&dep_newest);
      cmSystemTools::ExpandListArgument((string *)&msg_2,&outputs,false);
      std::__cxx11::string::~string((string *)&msg_2);
    }
    pbVar9 = depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((depends.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         depends.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      uVar7 = 1;
      if (bVar11 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
        std::operator<<((ostream *)&msg_2,
                        "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dep_newest);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&dep_newest,
                 (string *)
                 depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      while (pbVar10 = outputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start, pbVar9 = pbVar9 + 1,
            pbVar9 != depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        result = 0;
        bVar1 = cmFileTimeComparison::FileTimeCompare
                          (this->FileComparison,dep_newest._M_dataplus._M_p,
                           (pbVar9->_M_dataplus)._M_p,&result);
        if (!bVar1) {
          if (bVar11 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
            std::operator<<((ostream *)&msg_2,"Re-run cmake: build system dependency is missing\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(out_oldest._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&out_oldest);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
          }
          uVar7 = 1;
          goto LAB_0037f1a2;
        }
        if (result < 0) {
          std::__cxx11::string::_M_assign((string *)&dep_newest);
        }
      }
      std::__cxx11::string::string
                ((string *)&out_oldest,
                 (string *)
                 outputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      while (pbVar10 = pbVar10 + 1,
            pbVar10 !=
            outputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        result_1 = 0;
        bVar1 = cmFileTimeComparison::FileTimeCompare
                          (this->FileComparison,out_oldest._M_dataplus._M_p,
                           (pbVar10->_M_dataplus)._M_p,&result_1);
        if (!bVar1) {
          if (bVar11 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
            std::operator<<((ostream *)&msg_2,"Re-run cmake: build system output is missing\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout((char *)CONCAT44(uStack_a74,result));
            std::__cxx11::string::~string((string *)&result);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
          }
          uVar7 = 1;
          goto LAB_0037f195;
        }
        if (0 < result_1) {
          std::__cxx11::string::_M_assign((string *)&out_oldest);
        }
      }
      result_1 = 0;
      bVar1 = cmFileTimeComparison::FileTimeCompare
                        (this->FileComparison,out_oldest._M_dataplus._M_p,
                         dep_newest._M_dataplus._M_p,&result_1);
      bVar12 = result_1 < 0;
      if (bVar11 == true && (!bVar1 || bVar12)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
        poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake file: ");
        poVar4 = std::operator<<(poVar4,(string *)&out_oldest);
        poVar4 = std::operator<<(poVar4," older than: ");
        poVar4 = std::operator<<(poVar4,(string *)&dep_newest);
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)CONCAT44(uStack_a74,result));
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
      }
      uVar7 = (uint)(!bVar1 || bVar12);
LAB_0037f195:
      std::__cxx11::string::~string((string *)&out_oldest);
LAB_0037f1a2:
      std::__cxx11::string::~string((string *)&dep_newest);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&outputs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
LAB_0037f1c3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&products);
    if (pcVar3 == (cmLocalGenerator *)0x0) goto LAB_0037f1de;
  }
  (*pcVar3->_vptr_cmLocalGenerator[1])(pcVar3);
LAB_0037f1de:
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  ~cmake(&cm);
  return uVar7;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(gg.MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cmsys::auto_ptr<cmLocalGenerator> lgd(ggd->MakeLocalGenerator());
      lgd->ClearDependencies(mf, verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}